

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodyOwnMass.cpp
# Opt level: O2

void __thiscall chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(ChVariablesBodyOwnMass *this)

{
  ChVariablesBody::ChVariablesBody(&this->super_ChVariablesBody);
  (this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables =
       (_func_int **)&PTR__ChVariables_01187a00;
  ChMatrix33<double>::ChMatrix33(&this->inertia,1.0);
  this->mass = 1.0;
  ChMatrix33<double>::ChMatrix33(&this->inv_inertia,1.0);
  this->inv_mass = 1.0;
  return;
}

Assistant:

ChVariablesBodyOwnMass::ChVariablesBodyOwnMass() : mass(1), inv_mass(1), inertia(1), inv_inertia(1) {}